

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::compiler::Version::ByteSizeLong(Version *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) == 0) {
    sVar4 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->suffix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar4 = sVar4 + 1;
    }
    if ((uVar1 & 2) != 0) {
      uVar3 = (long)this->major_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 4) != 0) {
      uVar3 = (long)this->minor_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 8) != 0) {
      uVar3 = (long)this->patch_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar4,&this->_cached_size_);
  return sVar4;
}

Assistant:

size_t Version::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.Version)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    // optional string suffix = 4;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_suffix());
    }

    // optional int32 major = 1;
    if (cached_has_bits & 0x00000002u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_major());
    }

    // optional int32 minor = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_minor());
    }

    // optional int32 patch = 3;
    if (cached_has_bits & 0x00000008u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_patch());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}